

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chart.cpp
# Opt level: O0

string * __thiscall
Chart::renderWeekday_abi_cxx11_
          (string *__return_storage_ptr__,Chart *this,Datetime *day,Color *color)

{
  Color *this_00;
  uint uVar1;
  ostream *poVar2;
  int dow;
  string local_1f0;
  string local_1d0;
  stringstream local_1b0 [8];
  stringstream out;
  ostream local_1a0 [376];
  Color *local_28;
  Color *color_local;
  Datetime *day_local;
  Chart *this_local;
  
  local_28 = color;
  color_local = (Color *)day;
  day_local = &this->reference_datetime;
  this_local = (Chart *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b0);
  this_00 = local_28;
  uVar1 = Datetime::dayOfWeek((Datetime *)color_local);
  Datetime::dayNameShort_abi_cxx11_(&local_1f0,(Datetime *)(ulong)uVar1,dow);
  Color::colorize(&local_1d0,this_00,&local_1f0);
  poVar2 = std::operator<<(local_1a0,(string *)&local_1d0);
  std::operator<<(poVar2,' ');
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string Chart::renderWeekday (Datetime& day, const Color& color)
{
  std::stringstream out;

  out << color.colorize (Datetime::dayNameShort (day.dayOfWeek ()))
      << ' ';

  return out.str ();
}